

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::ComputeUnknownFieldsSize
                 (InternalMetadata *metadata,size_t total_size,CachedSize *cached_size)

{
  int iVar1;
  size_t sVar2;
  undefined1 *unknown_fields;
  
  if ((metadata->ptr_ & 1U) == 0) {
    unknown_fields = UnknownFieldSet::default_instance()::instance;
  }
  else {
    unknown_fields = (undefined1 *)((metadata->ptr_ & 0xfffffffffffffffeU) + 8);
  }
  sVar2 = WireFormat::ComputeUnknownFieldsSize((UnknownFieldSet *)unknown_fields);
  iVar1 = (int)(sVar2 + total_size);
  if ((iVar1 != 0) || (cached_size->atom_ != 0)) {
    cached_size->atom_ = iVar1;
  }
  return sVar2 + total_size;
}

Assistant:

size_t ComputeUnknownFieldsSize(const InternalMetadata& metadata,
                                size_t total_size, CachedSize* cached_size) {
  total_size += WireFormat::ComputeUnknownFieldsSize(
      metadata.unknown_fields<UnknownFieldSet>(
          UnknownFieldSet::default_instance));
  cached_size->Set(ToCachedSize(total_size));
  return total_size;
}